

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::LimitTests::init(LimitTests *this,EVP_PKEY_CTX *ctx)

{
  GetIntCase *this_00;
  long lVar1;
  LimitTests *pLVar2;
  uint local_14;
  int ndx;
  LimitTests *this_local;
  
  local_14 = 0;
  pLVar2 = this;
  while ((int)local_14 < 10) {
    this_00 = (GetIntCase *)operator_new(0x78);
    lVar1 = (long)(int)local_14;
    GetIntCase::GetIntCase
              (this_00,(this->super_TestCaseGroup).m_context,init::getIntCases[lVar1].name,
               init::getIntCases[lVar1].description,init::getIntCases[lVar1].param);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_14 = local_14 + 1;
    pLVar2 = (LimitTests *)(ulong)local_14;
  }
  return (int)pLVar2;
}

Assistant:

void init (void)
	{
		static const struct
		{
			const char*		name;
			const char*		description;
			GLenum			param;
		} getIntCases[] =
		{
			{ "vertex_attribs",					"Number of vertex attributes supported",							GL_MAX_VERTEX_ATTRIBS					},
			{ "varying_vectors",				"Number of varying vectors supported",								GL_MAX_VARYING_VECTORS					},
			{ "vertex_uniform_vectors",			"Number of vertex uniform vectors supported",						GL_MAX_VERTEX_UNIFORM_VECTORS			},
			{ "fragment_uniform_vectors",		"Number of fragment uniform vectors supported",						GL_MAX_FRAGMENT_UNIFORM_VECTORS			},
			{ "texture_image_units",			"Number of fragment texture units supported",						GL_MAX_TEXTURE_IMAGE_UNITS				},
			{ "vertex_texture_image_units",		"Number of vertex texture units supported",							GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS		},
			{ "combined_texture_image_units",	"Number of vertex and fragment combined texture units supported",	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS		},
			{ "texture_2d_size",				"Maximum 2D texture size",											GL_MAX_TEXTURE_SIZE						},
			{ "texture_cube_size",				"Maximum cubemap texture size",										GL_MAX_CUBE_MAP_TEXTURE_SIZE			},
			{ "renderbuffer_size",				"Maximum renderbuffer size",										GL_MAX_RENDERBUFFER_SIZE				},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(getIntCases); ndx++)
			addChild(new GetIntCase(m_context, getIntCases[ndx].name, getIntCases[ndx].description, getIntCases[ndx].param));
	}